

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O2

bool __thiscall OSTEI_Writer::IsSpecialPermutation_(OSTEI_Writer *this,QAM *am)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = (am->qam)._M_elems[0];
  if ((((iVar1 != 0) || ((am->qam)._M_elems[1] < 1)) ||
      ((bVar2 = true, (am->qam)._M_elems[2] != 0 && ((am->qam)._M_elems[3] != 0)))) &&
     ((((am->qam)._M_elems[2] != 0 || ((am->qam)._M_elems[3] < 1)) ||
      ((bVar2 = true, iVar1 != 0 && ((am->qam)._M_elems[1] != 0)))))) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool OSTEI_Writer::IsSpecialPermutation_(QAM am) const
{
    // is this a special permutation? Handle it that way if it is
    // NOTE: We never switch bra/ket, since that would affect the
    //       vectorization (since we vectorize on the ket)
    if( ( am[0] == 0 && am[1] > 0 ) && ( am[2] == 0 || am[3] == 0 ) )
        return true;
    if( ( am[2] == 0 && am[3] > 0 ) && ( am[0] == 0 || am[1] == 0 ) )
        return true;

    return false;
}